

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcZShapeProfileDef,_6UL>::Construct
                   (DB *db,LIST *params)

{
  IfcZShapeProfileDef *in;
  
  in = (IfcZShapeProfileDef *)operator_new(0xd8);
  *(undefined ***)&in->field_0xc0 = &PTR__Object_00806870;
  *(undefined8 *)&in->field_0xc8 = 0;
  *(char **)&in->field_0xd0 = "IfcZShapeProfileDef";
  Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef::IfcParameterizedProfileDef
            ((IfcParameterizedProfileDef *)in,&PTR_construction_vtable_24__008869e8);
  *(undefined8 *)&(in->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (in->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcZShapeProfileDef_00886958;
  *(undefined ***)&in->field_0xc0 = &PTR__IfcZShapeProfileDef_008869d0;
  *(undefined ***)&(in->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 =
       &PTR__IfcZShapeProfileDef_00886980;
  *(undefined ***)&(in->super_IfcParameterizedProfileDef).field_0x70 =
       &PTR__IfcZShapeProfileDef_008869a8;
  (in->FilletRadius).have = false;
  (in->EdgeRadius).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcZShapeProfileDef>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
         + (long)(in->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                 [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }